

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall Instrument::Instrument(Instrument *this,ISMSnoop *ismsnoop,string *path)

{
  bool *this_00;
  ISMSnoopInstrument *pIVar1;
  undefined1 local_2e8 [8];
  ResultBuilder __catchResult;
  
  this->ismsnoop_ = ismsnoop;
  pIVar1 = std::function<ISMSnoopInstrument_*(const_char_*)>::operator()
                     (&ismsnoop->open,(path->_M_dataplus)._M_p);
  this->instrument_ = pIVar1;
  this_00 = &__catchResult.m_shouldDebugBreak;
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)this_00,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Penhorse[P]ismsnoop/test/src/main.cpp"
             ,0x47);
  Catch::ResultBuilder::ResultBuilder
            ((ResultBuilder *)local_2e8,"REQUIRE",(SourceLineInfo *)this_00,"instrument_",Normal);
  std::__cxx11::string::~string((string *)this_00);
  __catchResult._664_8_ = (ResultBuilder *)local_2e8;
  Catch::ExpressionLhs<ISMSnoopInstrument_*const_&>::endExpression
            ((ExpressionLhs<ISMSnoopInstrument_*const_&> *)&__catchResult.m_shouldDebugBreak);
  Catch::ResultBuilder::react((ResultBuilder *)local_2e8);
  Catch::ResultBuilder::~ResultBuilder((ResultBuilder *)local_2e8);
  return;
}

Assistant:

Instrument::Instrument(const ISMSnoop & ismsnoop, const std::string & path)
	: ismsnoop_(&ismsnoop)
	, instrument_(ismsnoop_->open(path.c_str()))
{
	REQUIRE(instrument_);
}